

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

AEStackFrame __thiscall moira::Moira::makeFrame<40ul>(Moira *this,u32 addr,u32 pc,u16 sr,u16 ird)

{
  AEStackFrame AVar1;
  FunctionCode FVar2;
  undefined2 in_CX;
  u32 in_EDX;
  undefined4 in_ESI;
  Moira *in_RDI;
  ushort in_R8W;
  u16 read;
  AEStackFrame frame;
  undefined2 uStack_e;
  
  setFC(in_RDI,FC_USER_DATA);
  FVar2 = readFC(in_RDI);
  AVar1._2_2_ = uStack_e;
  AVar1.code = in_R8W & 0xffe0 | (ushort)FVar2;
  AVar1.addr = in_ESI;
  AVar1.ird = in_R8W;
  AVar1.sr = in_CX;
  AVar1.pc = in_EDX;
  return AVar1;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr, u32 pc, u16 sr, u16 ird)
{
    AEStackFrame frame;
    u16 read = 0x10;
    
    // Prepare
    if (F & AE_WRITE) read = 0;
    if (F & AE_PROG) setFC(FC_USER_PROG);
    if (F & AE_DATA) setFC(FC_USER_DATA);

    // Create
    frame.code = (ird & 0xFFE0) | readFC() | read;
    frame.addr = addr;
    frame.ird = ird;
    frame.sr = sr;
    frame.pc = pc;

    // Adjust
    if (F & AE_INC_PC) frame.pc += 2;
    if (F & AE_DEC_PC) frame.pc -= 2;
    if (F & AE_INC_ADDR) frame.addr += 2;
    if (F & AE_DEC_ADDR) frame.addr -= 2;
    if (F & AE_SET_CB3) frame.code |= (1 << 3);
        
    return frame;
}